

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffTest<Blob<128>,Blob<256>>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  byte in_CL;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  bool result;
  int i;
  Blob<256> h2;
  Blob<256> h1;
  Blob<128> k2;
  Blob<128> k1;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> diffs;
  Rand r;
  double expected;
  double testcount;
  double diffcount;
  int hashbits;
  int keybits;
  uint32_t in_stack_fffffffffffffefc;
  Rand *in_stack_ffffffffffffff00;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  Rand *this;
  int in_stack_ffffffffffffff2c;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffff40;
  Blob<128> *in_stack_ffffffffffffff48;
  pfHash in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff60;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffff68;
  Blob<128> local_8c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_70 [2];
  double local_38;
  Rand *local_30;
  double local_28;
  undefined4 local_1c;
  undefined4 local_18;
  byte local_11;
  uint local_10;
  uint local_c;
  code *local_8;
  
  local_11 = in_CL & 1;
  local_18 = 0x80;
  local_1c = 0x100;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_28 = chooseUpToK((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                         (int)in_stack_ffffffffffffff00);
  this = (Rand *)(local_28 * (double)(int)local_10);
  local_30 = this;
  local_38 = pow(2.0,256.0);
  local_38 = (double)this / local_38;
  Rand::Rand(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x1a0901);
  Blob<128>::Blob((Blob<128> *)local_70);
  Blob<128>::Blob(&local_8c);
  Blob<256>::Blob((Blob<256> *)&stack0xffffffffffffff54);
  Blob<256>::Blob((Blob<256> *)&stack0xffffffffffffff34);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",local_28,
         (ulong)local_c,0x80,0x100);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",local_30,local_38,
         (ulong)local_10);
  iVar3 = 0;
  while (iVar3 < (int)local_10) {
    iVar4 = iVar3;
    if (iVar3 % ((int)local_10 / 10) == 0) {
      printf(".");
    }
    Rand::rand_p(this,(void *)CONCAT44(iVar3,in_stack_ffffffffffffff18),
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    in_stack_ffffffffffffff10 = local_70;
    Blob<128>::operator=(&local_8c,(Blob<128> *)in_stack_ffffffffffffff10);
    (*local_8)(in_stack_ffffffffffffff10,0x10,0,&stack0xffffffffffffff54);
    DiffTestRecurse<Blob<128>,Blob<256>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (Blob<128> *)in_stack_ffffffffffffff40,
               (Blob<256> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (Blob<256> *)CONCAT44(in_stack_ffffffffffffff34,iVar4),in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
    iVar3 = iVar4 + 1;
  }
  printf("\n");
  bVar2 = 1;
  bVar1 = ProcessDifferentials<Blob<128>>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                     SUB41(in_stack_ffffffffffffff38,3));
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector(in_stack_ffffffffffffff10);
  return (bVar2 & 1 & bVar1) != 0;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}